

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O3

ngram_model_t *
ngram_model_read(cmd_ln_t *config,char *file_name,ngram_file_type_t file_type,logmath_t *lmath)

{
  ngram_model_t *pnVar1;
  double dVar2;
  double dVar3;
  
  if (file_type == NGRAM_BIN) {
    pnVar1 = ngram_model_trie_read_bin(config,file_name,lmath);
  }
  else {
    if (file_type == NGRAM_ARPA) {
      pnVar1 = ngram_model_trie_read_arpa(config,file_name,lmath);
      goto LAB_001315c2;
    }
    if (file_type != NGRAM_AUTO) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
              ,0x9f,"language model file type not supported\n");
      return (ngram_model_t *)0x0;
    }
    pnVar1 = ngram_model_trie_read_bin(config,file_name,lmath);
    if (pnVar1 != (ngram_model_t *)0x0) goto LAB_001315c2;
    pnVar1 = ngram_model_trie_read_arpa(config,file_name,lmath);
  }
  if ((pnVar1 == (ngram_model_t *)0x0) &&
     (pnVar1 = ngram_model_trie_read_dmp(config,file_name,lmath), pnVar1 == (ngram_model_t *)0x0)) {
    return (ngram_model_t *)0x0;
  }
LAB_001315c2:
  if (config != (cmd_ln_t *)0x0) {
    dVar2 = ps_config_float(config,"lw");
    dVar3 = ps_config_float(config,"wip");
    (*pnVar1->funcs->apply_weights)(pnVar1,(float32)(float)dVar2,(float32)(float)dVar3);
  }
  return pnVar1;
}

Assistant:

ngram_model_t *
ngram_model_read(cmd_ln_t * config,
                 const char *file_name,
                 ngram_file_type_t file_type, logmath_t * lmath)
{
    ngram_model_t *model = NULL;
    switch (file_type) {
    case NGRAM_AUTO:{
            if ((model =
                 ngram_model_trie_read_bin(config, file_name,
                                           lmath)) != NULL)
                break;
            if ((model =
                 ngram_model_trie_read_arpa(config, file_name,
                                            lmath)) != NULL)
                break;
            if ((model =
                 ngram_model_trie_read_dmp(config, file_name,
                                           lmath)) != NULL)
                break;
            return NULL;
        }
    case NGRAM_ARPA:
        model = ngram_model_trie_read_arpa(config, file_name, lmath);
        break;
    case NGRAM_BIN:
        if ((model =
             ngram_model_trie_read_bin(config, file_name, lmath)) != NULL)
            break;
        if ((model =
             ngram_model_trie_read_dmp(config, file_name, lmath)) != NULL)
            break;
        return NULL;
    default:
        E_ERROR("language model file type not supported\n");
        return NULL;
    }

    /* Now set weights based on config if present. */
    if (config) {
        float32 lw = 1.0;
        float32 wip = 1.0;

        lw = ps_config_float(config, "lw");
        wip = ps_config_float(config, "wip");

        ngram_model_apply_weights(model, lw, wip);
    }

    return model;
}